

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_type *ttype)

{
  t_program *ptVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string name;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_80,"",(allocator *)&local_a0);
  ptVar1 = ttype->program_;
  if ((ptVar1 != (t_program *)0x0) &&
     (ptVar1 != (this->super_t_oop_generator).super_t_generator.program_)) {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x11])(ttype);
    if ((char)iVar2 == '\0') {
      std::operator+(&local_a0,&ptVar1->name_,"_types.");
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  std::__cxx11::string::string((string *)&local_a0,(string *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    if ((char)iVar2 == '\0') goto LAB_002a935c;
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  std::__cxx11::string::string((string *)&local_60,(string *)CONCAT44(extraout_var_00,iVar2));
  t_generator::capitalize(&local_40,(t_generator *)this,&local_60);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
LAB_002a935c:
  std::operator+(__return_storage_ptr__,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::type_name(t_type* ttype) {
  string prefix = "";
  t_program* program = ttype->get_program();
  if (program != nullptr && program != program_) {
    if (!ttype->is_service()) {
      prefix = program->get_name() + "_types.";
    }
  }

  string name = ttype->get_name();
  if (ttype->is_struct() || ttype->is_xception()) {
    name = capitalize(ttype->get_name());
  }

  return prefix + name;
}